

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestCamelCaseFieldNames::_InternalSerialize
          (TestCamelCaseFieldNames *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ForeignMessage *value;
  _func_int **pp_Var1;
  TestCamelCaseFieldNames *pTVar2;
  ptrdiff_t pVar3;
  uint32_t uVar4;
  bool bVar5;
  int32_t value_00;
  int iVar6;
  ForeignEnum value_01;
  uint32_t *puVar7;
  char *pcVar8;
  RepeatedField<int> *pRVar9;
  const_reference piVar10;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar11;
  void *pvVar12;
  RepeatedPtrField<proto2_unittest::ForeignMessage> *this_00;
  const_reference this_01;
  UnknownFieldSet *unknown_fields;
  byte *pbVar13;
  string_view sVar14;
  string_view local_218;
  const_reference local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_2;
  int n_5;
  int i_5;
  const_reference local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1;
  int n_4;
  int i_4;
  ForeignMessage *repfield;
  uint n_3;
  uint i_3;
  int n_2;
  int i_2;
  const_reference local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  int n_1;
  int i_1;
  int n;
  int i;
  char *local_190;
  string_view local_188;
  string *local_178;
  string *_s_2;
  char *local_168;
  string_view local_160;
  string *local_150;
  string *_s_1;
  char *local_140;
  string_view local_138;
  string *local_128;
  string *_s;
  TestCamelCaseFieldNames *pTStack_118;
  uint32_t cached_has_bits;
  TestCamelCaseFieldNames *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestCamelCaseFieldNames *this_local;
  char *local_f0;
  size_t local_e8;
  ptrdiff_t size_2;
  const_reference local_d8;
  uint32_t local_cc;
  TestCamelCaseFieldNames *local_c8;
  EpsCopyOutputStream *local_c0;
  string_view local_b8;
  size_t local_a8;
  ptrdiff_t size_1;
  const_reference local_98;
  uint32_t local_8c;
  TestCamelCaseFieldNames *local_88;
  EpsCopyOutputStream *local_80;
  string_view local_78;
  size_t local_68;
  ptrdiff_t size;
  const_reference local_58;
  uint32_t local_4c;
  TestCamelCaseFieldNames *local_48;
  EpsCopyOutputStream *local_40;
  byte *local_38;
  uint local_2c;
  byte *local_28;
  uint local_1c;
  byte *local_18;
  uint local_c;
  
  _s._4_4_ = 0;
  pTStack_118 = this;
  this_ = (TestCamelCaseFieldNames *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar7 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  pTVar2 = this_;
  _s._4_4_ = *puVar7;
  if ((_s._4_4_ & 0x10) != 0) {
    value_00 = _internal_primitivefield(pTStack_118);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             ((EpsCopyOutputStream *)pTVar2,value_00,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 1) != 0) {
    local_128 = _internal_stringfield_abi_cxx11_(pTStack_118);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_138,"proto2_unittest.TestCamelCaseFieldNames.StringField");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar8,iVar6,SERIALIZE,local_138);
    pTVar2 = this_;
    sVar14 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_128);
    local_140 = sVar14._M_str;
    _s_1 = (string *)sVar14._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar2,2,sVar14,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x20) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value_01 = _internal_enumfield(pTStack_118);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray
                             (3,value_01,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 8) != 0) {
    value = (pTStack_118->field_0)._impl_.messagefield_;
    iVar6 = proto2_unittest::ForeignMessage::GetCachedSize
                      ((pTStack_118->field_0)._impl_.messagefield_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)value,iVar6,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 2) != 0) {
    local_150 = _internal_stringpiecefield_abi_cxx11_(pTStack_118);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_160,"proto2_unittest.TestCamelCaseFieldNames.StringPieceField");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar8,iVar6,SERIALIZE,local_160);
    pTVar2 = this_;
    sVar14 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_150);
    local_168 = sVar14._M_str;
    _s_2 = (string *)sVar14._M_len;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar2,5,sVar14,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 4) != 0) {
    local_178 = _internal_cordfield_abi_cxx11_(pTStack_118);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_188,"proto2_unittest.TestCamelCaseFieldNames.CordField");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar8,iVar6,SERIALIZE,local_188);
    pTVar2 = this_;
    _n = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_178);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pTVar2,6,_n,(uint8_t *)stream_local);
  }
  i_1 = 0;
  n_1 = _internal_repeatedprimitivefield_size(pTStack_118);
  for (; i_1 < n_1; i_1 = i_1 + 1) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    pRVar9 = _internal_repeatedprimitivefield(pTStack_118);
    piVar10 = google::protobuf::RepeatedField<int>::Get(pRVar9,i_1);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                             (7,*piVar10,(uint8_t *)stream_local);
  }
  s._4_4_ = 0;
  s._0_4_ = _internal_repeatedstringfield_size(pTStack_118);
  for (; s._4_4_ < (int)s; s._4_4_ = s._4_4_ + 1) {
    pRVar11 = _internal_repeatedstringfield_abi_cxx11_(pTStack_118);
    local_1b0 = google::protobuf::
                RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get(pRVar11,s._4_4_);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&n_2,
               "proto2_unittest.TestCamelCaseFieldNames.RepeatedStringField");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(pcVar8,iVar6,SERIALIZE,_n_2);
    pTVar2 = this_;
    local_48 = this_;
    local_4c = 8;
    local_58 = local_1b0;
    size = (ptrdiff_t)stream_local;
    local_68 = std::__cxx11::string::size();
    pVar3 = size;
    bVar5 = true;
    if ((long)local_68 < 0x80) {
      pp_Var1 = (pTVar2->super_Message).super_MessageLite._vptr_MessageLite;
      iVar6 = google::protobuf::io::EpsCopyOutputStream::TagSize(local_4c << 3);
      bVar5 = (long)pp_Var1 + (-(long)iVar6 - pVar3) + 0xf < (long)local_68;
    }
    uVar4 = local_4c;
    if (bVar5) {
      sVar14 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
      local_78 = sVar14;
      local_40 = (EpsCopyOutputStream *)
                 google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           ((EpsCopyOutputStream *)pTVar2,uVar4,sVar14,(uint8_t *)size);
    }
    else {
      local_38 = (byte *)size;
      for (local_2c = local_4c << 3 | 2; 0x7f < local_2c; local_2c = local_2c >> 7) {
        *local_38 = (byte)local_2c | 0x80;
        local_38 = local_38 + 1;
      }
      *local_38 = (byte)local_2c;
      pbVar13 = local_38 + 2;
      local_38[1] = (byte)local_68;
      size = (ptrdiff_t)pbVar13;
      local_38 = local_38 + 1;
      pvVar12 = (void *)std::__cxx11::string::data();
      memcpy(pbVar13,pvVar12,local_68);
      local_40 = (EpsCopyOutputStream *)(size + local_68);
    }
    stream_local = local_40;
  }
  i_3 = 0;
  n_3 = _internal_repeatedenumfield_size(pTStack_118);
  for (; (int)i_3 < (int)n_3; i_3 = i_3 + 1) {
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    pRVar9 = _internal_repeatedenumfield(pTStack_118);
    piVar10 = google::protobuf::RepeatedField<int>::Get(pRVar9,i_3);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray
                             (9,*piVar10,(uint8_t *)stream_local);
  }
  repfield._4_4_ = 0;
  repfield._0_4_ = _internal_repeatedmessagefield_size(pTStack_118);
  for (; repfield._4_4_ < (uint)repfield; repfield._4_4_ = repfield._4_4_ + 1) {
    this_00 = _internal_repeatedmessagefield(pTStack_118);
    this_01 = google::protobuf::RepeatedPtrField<proto2_unittest::ForeignMessage>::Get
                        (this_00,repfield._4_4_);
    _n_4 = this_01;
    iVar6 = proto2_unittest::ForeignMessage::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (10,(MessageLite *)this_01,iVar6,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  s_1._4_4_ = 0;
  s_1._0_4_ = _internal_repeatedstringpiecefield_size(pTStack_118);
  for (; s_1._4_4_ < (int)s_1; s_1._4_4_ = s_1._4_4_ + 1) {
    pRVar11 = _internal_repeatedstringpiecefield_abi_cxx11_(pTStack_118);
    local_1e8 = google::protobuf::
                RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get(pRVar11,s_1._4_4_);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&n_5,
               "proto2_unittest.TestCamelCaseFieldNames.RepeatedStringPieceField");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(pcVar8,iVar6,SERIALIZE,_n_5);
    pTVar2 = this_;
    local_88 = this_;
    local_8c = 0xb;
    local_98 = local_1e8;
    size_1 = (ptrdiff_t)stream_local;
    local_a8 = std::__cxx11::string::size();
    pVar3 = size_1;
    bVar5 = true;
    if ((long)local_a8 < 0x80) {
      pp_Var1 = (pTVar2->super_Message).super_MessageLite._vptr_MessageLite;
      iVar6 = google::protobuf::io::EpsCopyOutputStream::TagSize(local_8c << 3);
      bVar5 = (long)pp_Var1 + (-(long)iVar6 - pVar3) + 0xf < (long)local_a8;
    }
    uVar4 = local_8c;
    if (bVar5) {
      sVar14 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
      local_b8 = sVar14;
      local_80 = (EpsCopyOutputStream *)
                 google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           ((EpsCopyOutputStream *)pTVar2,uVar4,sVar14,(uint8_t *)size_1);
    }
    else {
      local_28 = (byte *)size_1;
      for (local_1c = local_8c << 3 | 2; 0x7f < local_1c; local_1c = local_1c >> 7) {
        *local_28 = (byte)local_1c | 0x80;
        local_28 = local_28 + 1;
      }
      *local_28 = (byte)local_1c;
      pbVar13 = local_28 + 2;
      local_28[1] = (byte)local_a8;
      size_1 = (ptrdiff_t)pbVar13;
      local_28 = local_28 + 1;
      pvVar12 = (void *)std::__cxx11::string::data();
      memcpy(pbVar13,pvVar12,local_a8);
      local_80 = (EpsCopyOutputStream *)(size_1 + local_a8);
    }
    stream_local = local_80;
  }
  s_2._4_4_ = 0;
  s_2._0_4_ = _internal_repeatedcordfield_size(pTStack_118);
  for (; s_2._4_4_ < (int)s_2; s_2._4_4_ = s_2._4_4_ + 1) {
    pRVar11 = _internal_repeatedcordfield_abi_cxx11_(pTStack_118);
    local_208 = google::protobuf::
                RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get(pRVar11,s_2._4_4_);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_218,"proto2_unittest.TestCamelCaseFieldNames.RepeatedCordField");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar8,iVar6,SERIALIZE,local_218);
    pTVar2 = this_;
    local_c8 = this_;
    local_cc = 0xc;
    local_d8 = local_208;
    size_2 = (ptrdiff_t)stream_local;
    local_e8 = std::__cxx11::string::size();
    pVar3 = size_2;
    bVar5 = true;
    if ((long)local_e8 < 0x80) {
      pp_Var1 = (pTVar2->super_Message).super_MessageLite._vptr_MessageLite;
      iVar6 = google::protobuf::io::EpsCopyOutputStream::TagSize(local_cc << 3);
      bVar5 = (long)pp_Var1 + (-(long)iVar6 - pVar3) + 0xf < (long)local_e8;
    }
    uVar4 = local_cc;
    if (bVar5) {
      sVar14 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d8);
      local_f0 = sVar14._M_str;
      this_local = (TestCamelCaseFieldNames *)sVar14._M_len;
      local_c0 = (EpsCopyOutputStream *)
                 google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           ((EpsCopyOutputStream *)pTVar2,uVar4,sVar14,(uint8_t *)size_2);
    }
    else {
      local_18 = (byte *)size_2;
      for (local_c = local_cc << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
        *local_18 = (byte)local_c | 0x80;
        local_18 = local_18 + 1;
      }
      *local_18 = (byte)local_c;
      pbVar13 = local_18 + 2;
      local_18[1] = (byte)local_e8;
      size_2 = (ptrdiff_t)pbVar13;
      local_18 = local_18 + 1;
      pvVar12 = (void *)std::__cxx11::string::data();
      memcpy(pbVar13,pvVar12,local_e8);
      local_c0 = (EpsCopyOutputStream *)(size_2 + local_e8);
    }
    stream_local = local_c0;
  }
  bVar5 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(pTStack_118->super_Message).super_MessageLite._internal_metadata_);
  if (bVar5) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pTStack_118->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestCamelCaseFieldNames::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestCamelCaseFieldNames& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestCamelCaseFieldNames)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 PrimitiveField = 1;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_primitivefield(), target);
  }

  // string StringField = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_stringfield();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.StringField");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // .proto2_unittest.ForeignEnum EnumField = 3;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_enumfield(), target);
  }

  // .proto2_unittest.ForeignMessage MessageField = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.messagefield_, this_._impl_.messagefield_->GetCachedSize(), target,
        stream);
  }

  // string StringPieceField = 5 [ctype = STRING_PIECE];
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_stringpiecefield();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.StringPieceField");
    target = stream->WriteStringMaybeAliased(5, _s, target);
  }

  // string CordField = 6 [ctype = CORD];
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_cordfield();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.CordField");
    target = stream->WriteStringMaybeAliased(6, _s, target);
  }

  // repeated int32 RepeatedPrimitiveField = 7;
  for (int i = 0, n = this_._internal_repeatedprimitivefield_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        7, this_._internal_repeatedprimitivefield().Get(i), target);
  }

  // repeated string RepeatedStringField = 8;
  for (int i = 0, n = this_._internal_repeatedstringfield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedstringfield().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.RepeatedStringField");
    target = stream->WriteString(8, s, target);
  }

  // repeated .proto2_unittest.ForeignEnum RepeatedEnumField = 9;
  for (int i = 0, n = this_._internal_repeatedenumfield_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        9, static_cast<::proto2_unittest::ForeignEnum>(this_._internal_repeatedenumfield().Get(i)),
        target);
  }

  // repeated .proto2_unittest.ForeignMessage RepeatedMessageField = 10;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeatedmessagefield_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeatedmessagefield().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            10, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated string RepeatedStringPieceField = 11 [ctype = STRING_PIECE];
  for (int i = 0, n = this_._internal_repeatedstringpiecefield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedstringpiecefield().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.RepeatedStringPieceField");
    target = stream->WriteString(11, s, target);
  }

  // repeated string RepeatedCordField = 12 [ctype = CORD];
  for (int i = 0, n = this_._internal_repeatedcordfield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedcordfield().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestCamelCaseFieldNames.RepeatedCordField");
    target = stream->WriteString(12, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestCamelCaseFieldNames)
  return target;
}